

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O0

Aig_Man_t *
Saig_ManCbaUnrollWithCex
          (Aig_Man_t *pAig,Abc_Cex_t *pCex,int nInputs,Vec_Int_t **pvMapPiF2A,
          Vec_Vec_t **pvReg2Frame)

{
  Vec_Ptr_t *pVVar1;
  anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 aVar2;
  Vec_Vec_t *pVVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  Vec_Vec_t *p;
  Vec_Vec_t *p_00;
  Aig_Obj_t *pAVar8;
  Vec_Int_t *pVVar9;
  Aig_Man_t *p_01;
  char *pcVar10;
  void *pvVar11;
  Aig_Obj_t *p1;
  Aig_Obj_t *pAVar12;
  Vec_Ptr_t *local_b0;
  int local_68;
  int iBit;
  int f;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vObjs;
  Vec_Int_t *vRoots;
  Vec_Vec_t *vFrameObjs;
  Vec_Vec_t *vFrameCos;
  Aig_Man_t *pFrames;
  Vec_Vec_t **pvReg2Frame_local;
  Vec_Int_t **pvMapPiF2A_local;
  int nInputs_local;
  Abc_Cex_t *pCex_local;
  Aig_Man_t *pAig_local;
  
  iVar4 = Saig_ManPiNum(pAig);
  if (iVar4 != pCex->nPis) {
    __assert_fail("Saig_ManPiNum(pAig) == pCex->nPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x198,
                  "Aig_Man_t *Saig_ManCbaUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **, Vec_Vec_t **)"
                 );
  }
  if ((pCex->iPo < 0) || (iVar4 = pCex->iPo, iVar5 = Saig_ManPoNum(pAig), iVar5 <= iVar4)) {
    __assert_fail("pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x19a,
                  "Aig_Man_t *Saig_ManCbaUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **, Vec_Vec_t **)"
                 );
  }
  pVVar7 = Vec_IntAlloc(1000);
  *pvMapPiF2A = pVVar7;
  p = Vec_VecStart(pCex->iFrame + 1);
  p_00 = Vec_VecStart(pCex->iFrame + 1);
  pAVar8 = Aig_ManCo(pAig,pCex->iPo);
  iVar4 = pCex->iFrame;
  iVar5 = Aig_ObjId(pAVar8);
  Vec_VecPushInt(p,iVar4,iVar5);
  for (local_68 = pCex->iFrame; -1 < local_68; local_68 = local_68 + -1) {
    Aig_ManIncrementTravId(pAig);
    pVVar7 = Vec_VecEntryInt(p,local_68);
    for (iBit = 0; iVar4 = Vec_IntSize(pVVar7), iBit < iVar4; iBit = iBit + 1) {
      iVar4 = Vec_IntEntry(pVVar7,iBit);
      pAVar8 = Aig_ManObj(pAig,iVar4);
      pVVar9 = Vec_VecEntryInt(p_00,local_68);
      if (local_68 == 0) {
        local_b0 = (Vec_Ptr_t *)0x0;
      }
      else {
        local_b0 = Vec_VecEntry(p,local_68 + -1);
      }
      Saig_ManCbaUnrollCollect_rec(pAig,pAVar8,pVVar9,(Vec_Int_t *)local_b0);
    }
  }
  p_01 = Aig_ManStart(10000);
  pcVar10 = Abc_UtilStrsav(pAig->pName);
  p_01->pName = pcVar10;
  pcVar10 = Abc_UtilStrsav(pAig->pSpec);
  p_01->pSpec = pcVar10;
  iVar4 = Saig_ManRegNum(pAig);
  if (iVar4 == pCex->nRegs) {
    for (iBit = 0; iVar4 = Saig_ManRegNum(pAig), iBit < iVar4; iBit = iBit + 1) {
      pVVar1 = pAig->vCis;
      iVar4 = Saig_ManPiNum(pAig);
      pvVar11 = Vec_PtrEntry(pVVar1,iBit + iVar4);
      pAVar8 = Aig_ManConst1(p_01);
      iVar4 = Abc_InfoHasBit((uint *)(pCex + 1),iBit);
      pAVar8 = Aig_NotCond(pAVar8,(uint)((iVar4 != 0 ^ 0xffU) & 1));
      *(Aig_Obj_t **)((long)pvVar11 + 0x28) = pAVar8;
    }
  }
  else {
    for (iBit = 0; iVar4 = Saig_ManRegNum(pAig), iBit < iVar4; iBit = iBit + 1) {
      pVVar1 = pAig->vCis;
      iVar4 = Saig_ManPiNum(pAig);
      pvVar11 = Vec_PtrEntry(pVVar1,iBit + iVar4);
      pAVar8 = Aig_ManConst1(p_01);
      pAVar8 = Aig_NotCond(pAVar8,1);
      *(Aig_Obj_t **)((long)pvVar11 + 0x28) = pAVar8;
    }
  }
  for (local_68 = 0; local_68 <= pCex->iFrame; local_68 = local_68 + 1) {
    pVVar7 = Vec_VecEntryInt(p_00,local_68);
    for (iBit = 0; iVar4 = Vec_IntSize(pVVar7), iBit < iVar4; iBit = iBit + 1) {
      iVar4 = Vec_IntEntry(pVVar7,iBit);
      pAVar8 = Aig_ManObj(pAig,iVar4);
      iVar4 = Aig_ObjIsNode(pAVar8);
      if (iVar4 == 0) {
        iVar4 = Aig_ObjIsCo(pAVar8);
        if (iVar4 == 0) {
          iVar4 = Aig_ObjIsConst1(pAVar8);
          if (iVar4 == 0) {
            iVar4 = Saig_ObjIsPi(pAig,pAVar8);
            if (iVar4 != 0) {
              iVar4 = Aig_ObjCioId(pAVar8);
              if (iVar4 < nInputs) {
                iVar4 = pCex->nRegs;
                iVar5 = pCex->nPis;
                iVar6 = Aig_ObjCioId(pAVar8);
                pAVar12 = Aig_ManConst1(p_01);
                iVar4 = Abc_InfoHasBit((uint *)(pCex + 1),iVar4 + local_68 * iVar5 + iVar6);
                pAVar12 = Aig_NotCond(pAVar12,(uint)((iVar4 != 0 ^ 0xffU) & 1));
                (pAVar8->field_5).pData = pAVar12;
              }
              else {
                pAVar12 = Aig_ObjCreateCi(p_01);
                (pAVar8->field_5).pData = pAVar12;
                pVVar9 = *pvMapPiF2A;
                iVar4 = Aig_ObjCioId(pAVar8);
                Vec_IntPush(pVVar9,iVar4);
                Vec_IntPush(*pvMapPiF2A,local_68);
              }
            }
          }
          else {
            pAVar12 = Aig_ManConst1(p_01);
            (pAVar8->field_5).pData = pAVar12;
          }
        }
        else {
          pAVar12 = Aig_ObjChild0Copy(pAVar8);
          (pAVar8->field_5).pData = pAVar12;
        }
      }
      else {
        pAVar12 = Aig_ObjChild0Copy(pAVar8);
        p1 = Aig_ObjChild1Copy(pAVar8);
        pAVar12 = Aig_And(p_01,pAVar12,p1);
        (pAVar8->field_5).pData = pAVar12;
      }
    }
    if (local_68 == pCex->iFrame) break;
    pVVar7 = Vec_VecEntryInt(p,local_68);
    for (iBit = 0; iVar4 = Vec_IntSize(pVVar7), iBit < iVar4; iBit = iBit + 1) {
      iVar4 = Vec_IntEntry(pVVar7,iBit);
      pAVar8 = Aig_ManObj(pAig,iVar4);
      aVar2 = pAVar8->field_5;
      pAVar12 = Saig_ObjLiToLo(pAig,pAVar8);
      pAVar12->field_5 = aVar2;
      if (*pvReg2Frame != (Vec_Vec_t *)0x0) {
        pVVar3 = *pvReg2Frame;
        iVar4 = Aig_ObjId(pAVar8);
        Vec_VecPushInt(pVVar3,local_68,iVar4);
        pVVar3 = *pvReg2Frame;
        iVar4 = Aig_ObjToLit((Aig_Obj_t *)(pAVar8->field_5).pData);
        Vec_VecPushInt(pVVar3,local_68,iVar4);
      }
    }
  }
  pAVar8 = Aig_ManCo(pAig,pCex->iPo);
  pAVar8 = Aig_Not((Aig_Obj_t *)(pAVar8->field_5).pData);
  Aig_ObjCreateCo(p_01,pAVar8);
  Aig_ManSetRegNum(p_01,0);
  Vec_VecFree(p);
  Vec_VecFree(p_00);
  Aig_ManCleanup(p_01);
  return p_01;
}

Assistant:

Aig_Man_t * Saig_ManCbaUnrollWithCex( Aig_Man_t * pAig, Abc_Cex_t * pCex, int nInputs, Vec_Int_t ** pvMapPiF2A, Vec_Vec_t ** pvReg2Frame )
{
    Aig_Man_t * pFrames;     // unrolled timeframes
    Vec_Vec_t * vFrameCos;   // the list of COs per frame
    Vec_Vec_t * vFrameObjs;  // the list of objects per frame
    Vec_Int_t * vRoots, * vObjs;
    Aig_Obj_t * pObj;
    int i, f;
    // sanity checks
    assert( Saig_ManPiNum(pAig) == pCex->nPis );
//    assert( Saig_ManRegNum(pAig) == pCex->nRegs );
    assert( pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig) );

    // map PIs of the unrolled frames into PIs of the original design
    *pvMapPiF2A = Vec_IntAlloc( 1000 );

    // collect COs and Objs visited in each frame
    vFrameCos  = Vec_VecStart( pCex->iFrame+1 );
    vFrameObjs = Vec_VecStart( pCex->iFrame+1 );
    // initialized the topmost frame
    pObj = Aig_ManCo( pAig, pCex->iPo );
    Vec_VecPushInt( vFrameCos, pCex->iFrame, Aig_ObjId(pObj) );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // collect nodes starting from the roots
        Aig_ManIncrementTravId( pAig );
        vRoots = Vec_VecEntryInt( vFrameCos, f );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
            Saig_ManCbaUnrollCollect_rec( pAig, pObj, 
                Vec_VecEntryInt(vFrameObjs, f),
                (Vec_Int_t *)(f ? Vec_VecEntry(vFrameCos, f-1) : NULL) );
    }

    // derive unrolled timeframes
    pFrames = Aig_ManStart( 10000 );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // initialize the flops 
    if ( Saig_ManRegNum(pAig) == pCex->nRegs )
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), !Abc_InfoHasBit(pCex->pData, i) );
    }
    else // this is the case when synthesis was applied, assume all-0 init state
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), 1 );
    }
    // iterate through the frames
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        // construct
        vObjs = Vec_VecEntryInt( vFrameObjs, f );
        Aig_ManForEachObjVec( vObjs, pAig, pObj, i )
        {
            if ( Aig_ObjIsNode(pObj) )
                pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
            else if ( Aig_ObjIsCo(pObj) )
                pObj->pData = Aig_ObjChild0Copy(pObj);
            else if ( Aig_ObjIsConst1(pObj) )
                pObj->pData = Aig_ManConst1(pFrames);
            else if ( Saig_ObjIsPi(pAig, pObj) )
            {
                if ( Aig_ObjCioId(pObj) < nInputs )
                {
                    int iBit = pCex->nRegs + f * pCex->nPis + Aig_ObjCioId(pObj);
                    pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), !Abc_InfoHasBit(pCex->pData, iBit) );
                }
                else
                {
                    pObj->pData = Aig_ObjCreateCi( pFrames );
                    Vec_IntPush( *pvMapPiF2A, Aig_ObjCioId(pObj) );
                    Vec_IntPush( *pvMapPiF2A, f );
                }
            }
        }
        if ( f == pCex->iFrame )
            break;
        // transfer
        vRoots = Vec_VecEntryInt( vFrameCos, f );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
        {
            Saig_ObjLiToLo( pAig, pObj )->pData = pObj->pData;
            if ( *pvReg2Frame )
            {
                Vec_VecPushInt( *pvReg2Frame, f, Aig_ObjId(pObj) );             // record LO
                Vec_VecPushInt( *pvReg2Frame, f, Aig_ObjToLit((Aig_Obj_t *)pObj->pData) ); // record its literal
            }
        }
    }
    // create output
    pObj = Aig_ManCo( pAig, pCex->iPo );
    Aig_ObjCreateCo( pFrames, Aig_Not((Aig_Obj_t *)pObj->pData) );
    Aig_ManSetRegNum( pFrames, 0 );
    // cleanup
    Vec_VecFree( vFrameCos );
    Vec_VecFree( vFrameObjs );
    // finallize
    Aig_ManCleanup( pFrames );
    // return
    return pFrames;
}